

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode cf_ssl_find_peer_by_key
                   (Curl_easy *data,Curl_ssl_scache *scache,char *ssl_peer_key,
                   ssl_primary_config *conn_config,Curl_ssl_scache_peer **ppeer)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  uchar local_78 [8];
  uchar my_hmac [32];
  size_t sStack_48;
  CURLcode result;
  size_t peer_key_len;
  size_t i;
  Curl_ssl_scache_peer **ppeer_local;
  ssl_primary_config *conn_config_local;
  char *ssl_peer_key_local;
  Curl_ssl_scache *scache_local;
  Curl_easy *data_local;
  
  sStack_48 = 0;
  *ppeer = (Curl_ssl_scache_peer *)0x0;
  if ((scache == (Curl_ssl_scache *)0x0) || (scache->magic != 0xe1551)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_ssls.log_level)) {
    Curl_trc_ssls(data,"find peer slot for %s among %zu slots",ssl_peer_key,scache->peer_count);
  }
  peer_key_len = 0;
  while( true ) {
    bVar5 = false;
    if (scache != (Curl_ssl_scache *)0x0) {
      bVar5 = peer_key_len < scache->peer_count;
    }
    if (!bVar5) break;
    if (((scache->peers[peer_key_len].ssl_peer_key != (char *)0x0) &&
        (iVar3 = curl_strequal(ssl_peer_key,scache->peers[peer_key_len].ssl_peer_key), iVar3 != 0))
       && (_Var1 = cf_ssl_scache_match_auth(scache->peers + peer_key_len,conn_config), _Var1)) {
      *ppeer = scache->peers + peer_key_len;
      return CURLE_OK;
    }
    peer_key_len = peer_key_len + 1;
  }
  peer_key_len = 0;
  while( true ) {
    bVar5 = false;
    if (scache != (Curl_ssl_scache *)0x0) {
      bVar5 = peer_key_len < scache->peer_count;
    }
    if (!bVar5) break;
    if (((scache->peers[peer_key_len].ssl_peer_key == (char *)0x0) &&
        ((scache->peers[peer_key_len].field_0xa0 & 1) != 0)) &&
       (_Var1 = cf_ssl_scache_match_auth(scache->peers + peer_key_len,conn_config), _Var1)) {
      if (sStack_48 == 0) {
        sStack_48 = strlen(ssl_peer_key);
      }
      CVar2 = Curl_hmacit(&Curl_HMAC_SHA256,scache->peers[peer_key_len].key_salt,0x20,
                          (uchar *)ssl_peer_key,sStack_48,local_78);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      iVar3 = memcmp(scache->peers[peer_key_len].key_hmac,local_78,0x20);
      if (iVar3 == 0) {
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_ssls.log_level)) {
          Curl_trc_ssls(data,"peer entry %zu key recovered: %s",peer_key_len,ssl_peer_key);
        }
        pcVar4 = (*Curl_cstrdup)(ssl_peer_key);
        scache->peers[peer_key_len].ssl_peer_key = pcVar4;
        if (scache->peers[peer_key_len].ssl_peer_key == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        cf_ssl_cache_peer_update(scache->peers + peer_key_len);
        *ppeer = scache->peers + peer_key_len;
        return CURLE_OK;
      }
    }
    peer_key_len = peer_key_len + 1;
  }
  if (data == (Curl_easy *)0x0) {
    return CURLE_OK;
  }
  if ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) == 0) {
    return CURLE_OK;
  }
  if (((data->state).feat != (curl_trc_feat *)0x0) && (((data->state).feat)->log_level < 1)) {
    return CURLE_OK;
  }
  if (Curl_trc_feat_ssls.log_level < 1) {
    return CURLE_OK;
  }
  Curl_trc_ssls(data,"peer not found for %s",ssl_peer_key);
  return CURLE_OK;
}

Assistant:

static CURLcode
cf_ssl_find_peer_by_key(struct Curl_easy *data,
                        struct Curl_ssl_scache *scache,
                        const char *ssl_peer_key,
                        struct ssl_primary_config *conn_config,
                        struct Curl_ssl_scache_peer **ppeer)
{
  size_t i, peer_key_len = 0;
  CURLcode result = CURLE_OK;

  *ppeer = NULL;
  if(!GOOD_SCACHE(scache)) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  CURL_TRC_SSLS(data, "find peer slot for %s among %zu slots",
                ssl_peer_key, scache->peer_count);

  /* check for entries with known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(scache->peers[i].ssl_peer_key &&
       strcasecompare(ssl_peer_key, scache->peers[i].ssl_peer_key) &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* yes, we have a cached session for this! */
      *ppeer = &scache->peers[i];
      goto out;
    }
  }
  /* check for entries with HMAC set but no known peer_key */
  for(i = 0; scache && i < scache->peer_count; i++) {
    if(!scache->peers[i].ssl_peer_key &&
       scache->peers[i].hmac_set &&
       cf_ssl_scache_match_auth(&scache->peers[i], conn_config)) {
      /* possible entry with unknown peer_key, check hmac */
      unsigned char my_hmac[CURL_SHA256_DIGEST_LENGTH];
      if(!peer_key_len) /* we are lazy */
        peer_key_len = strlen(ssl_peer_key);
      result = Curl_hmacit(&Curl_HMAC_SHA256,
                           scache->peers[i].key_salt,
                           sizeof(scache->peers[i].key_salt),
                           (const unsigned char *)ssl_peer_key,
                           peer_key_len,
                           my_hmac);
      if(result)
        goto out;
      if(!memcmp(scache->peers[i].key_hmac, my_hmac, sizeof(my_hmac))) {
        /* remember peer_key for future lookups */
        CURL_TRC_SSLS(data, "peer entry %zu key recovered: %s",
                      i, ssl_peer_key);
        scache->peers[i].ssl_peer_key = strdup(ssl_peer_key);
        if(!scache->peers[i].ssl_peer_key) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        cf_ssl_cache_peer_update(&scache->peers[i]);
        *ppeer = &scache->peers[i];
        goto out;
      }
    }
  }
  CURL_TRC_SSLS(data, "peer not found for %s", ssl_peer_key);
out:
  return result;
}